

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMunitionsAppearance.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::GuidedMunitionsAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GuidedMunitionsAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KINT32 Value_02;
  KStringStream ss;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Guided Munitions Appearance:");
  poVar1 = std::operator<<(poVar1,"\n\tDamage:                 ");
  ENUMS::GetEnumAsStringEntityDamage_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)(*(uint *)this >> 3 & 3),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\tSmoke:                  ");
  ENUMS::GetEnumAsStringEntitySmoke_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)(*(uint *)this >> 5 & 3),Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\n\tTrailing Effect:        ");
  ENUMS::GetEnumAsStringEntityTrailingEffect_abi_cxx11_
            (&local_200,(ENUMS *)(ulong)(*(uint *)this >> 7 & 3),Value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"\n\tFlaming Effect:         ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tLaunch FLash:           ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tFrozen Status:          ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tPower Plant:            ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tState:                  ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tCover/Shroud Status:    ");
  ENUMS::GetEnumAsStringCoverShroudStatus_abi_cxx11_
            (&local_220,(ENUMS *)(ulong)((byte)this->field_0x3 & 3),Value_02);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  poVar1 = std::operator<<(poVar1,"\n\tMasked/Cloaked:         ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GuidedMunitionsAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "Guided Munitions Appearance:"       	   
       << "\n\tDamage:                 " << GetEnumAsStringEntityDamage( m_Damage )
       << "\n\tSmoke:                  " << GetEnumAsStringEntitySmoke( m_Smoke )
       << "\n\tTrailing Effect:        " << GetEnumAsStringEntityTrailingEffect( m_TrailingEffect )
       << "\n\tFlaming Effect:         " << m_FlamingEffectField		
       << "\n\tLaunch FLash:           " << m_LaunchFlash
       << "\n\tFrozen Status:          " << m_FrozenStatus
       << "\n\tPower Plant:            " << m_PowerPlantStatus
       << "\n\tState:                  " << m_State
       << "\n\tCover/Shroud Status:    " << GetEnumAsStringCoverShroudStatus( m_CoverShroudStatus )
       << "\n\tMasked/Cloaked:         " << m_MaskedCloaked
       << "\n";

    return ss.str();
}